

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::prepareFragmentShader
          (GeometryShaderMaxOutputComponentsTest *this,string *out_shader_code)

{
  ostream *poVar1;
  int iVar2;
  stringstream stream;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\nprecision highp int;\n\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"// definitions of gs_fs_out_ varyings go here\n",0x2e);
  if (0 < this->m_n_available_vectors) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"flat in ivec4",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_n_available_vectors);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\nlayout(location = 0) out int fs_out;\n\nvoid main()\n{\n    int sum = 0;\n\n    // sum calculation go here\n"
             ,0x66);
  if (0 < this->m_n_available_vectors) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sum += ",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".x + ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".y + ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".z + ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".w;\n",4);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_n_available_vectors);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n    fs_out = sum;\n}\n",0x15);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsTest::prepareFragmentShader(std::string& out_shader_code) const
{
	std::stringstream stream;

	stream << m_fragment_shader_code_preamble;
	stream << m_common_shader_code_gs_fs_out_definitions;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << m_fragment_shader_code_flat_in_ivec4 << " " << m_common_shader_code_gs_fs_out << i << ";\n";
	}

	stream << m_fragment_shader_code_body_begin;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << "    " << m_fragment_shader_code_sum << m_common_shader_code_gs_fs_out << i << ".x + "
			   << m_common_shader_code_gs_fs_out << i << ".y + " << m_common_shader_code_gs_fs_out << i << ".z + "
			   << m_common_shader_code_gs_fs_out << i << ".w;\n";
	}

	stream << m_fragment_shader_code_body_end;

	out_shader_code = stream.str();
}